

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache.cc
# Opt level: O1

string * __thiscall
ctemplate::TemplateCache::template_root_directory_abi_cxx11_
          (string *__return_storage_ptr__,TemplateCache *this)

{
  pointer pbVar1;
  pointer pbVar2;
  pointer pcVar3;
  int iVar4;
  size_t sVar5;
  ReaderMutexLock ml;
  ReaderMutexLock local_18;
  
  local_18.mu_ = this->search_path_mutex_;
  if (((pthread_rwlock_t *)((long)local_18.mu_ + 0x38))->__size[0] == '\x01') {
    iVar4 = pthread_rwlock_rdlock((pthread_rwlock_t *)local_18.mu_);
    if (iVar4 != 0) {
      abort();
    }
  }
  pbVar1 = (this->search_path_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (this->search_path_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (pbVar1 == pbVar2) {
    sVar5 = strlen("./");
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,&kCWD,(long)&kCWD + sVar5);
  }
  else {
    pcVar3 = (pbVar1->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar3,pcVar3 + pbVar1->_M_string_length);
  }
  ReaderMutexLock::~ReaderMutexLock(&local_18);
  return __return_storage_ptr__;
}

Assistant:

string TemplateCache::template_root_directory() const {
  ReaderMutexLock ml(search_path_mutex_);
  if (search_path_.empty()) {
    return kCWD;
  }
  return search_path_[0];
}